

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall google::protobuf::Map<long,_double>::InnerMap::~InnerMap(InnerMap *this)

{
  if (this->table_ != (void **)0x0) {
    clear(this);
    if ((this->alloc_).arena_ == (Arena *)0x0) {
      operator_delete(this->table_,this->num_buckets_ << 3);
      return;
    }
  }
  return;
}

Assistant:

~InnerMap() {
      if (table_ != NULL) {
        clear();
        Dealloc<void*>(table_, num_buckets_);
      }
    }